

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O1

void __thiscall QBuffer::setBuffer(QBuffer *this,QByteArray *byteArray)

{
  QObjectData *this_00;
  QObjectData *pQVar1;
  bool bVar2;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  bVar2 = QIODevice::isOpen(&this->super_QIODevice);
  if (!bVar2) {
    this_00 = pQVar1 + 5;
    if (byteArray == (QByteArray *)0x0) {
      byteArray = (QByteArray *)this_00;
    }
    pQVar1[4].bindingStorage.bindingStatus = (QBindingStatus *)byteArray;
    QByteArray::clear((QByteArray *)this_00);
    return;
  }
  setBuffer();
  return;
}

Assistant:

void QBuffer::setBuffer(QByteArray *byteArray)
{
    Q_D(QBuffer);
    if (isOpen()) {
        qWarning("QBuffer::setBuffer: Buffer is open");
        return;
    }
    if (byteArray) {
        d->buf = byteArray;
    } else {
        d->buf = &d->defaultBuf;
    }
    d->defaultBuf.clear();
}